

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelPackage.cpp
# Opt level: O3

unique_ptr<JsonMap,_std::default_delete<JsonMap>_> __thiscall
MPL::detail::ModelPackageImpl::getItemInfoEntries(ModelPackageImpl *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string *key;
  bool bVar2;
  JsonMap *pJVar3;
  long in_RSI;
  string local_48;
  
  pJVar3 = *(JsonMap **)(in_RSI + 0x78);
  paVar1 = &local_48.field_2;
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"itemInfoEntries","");
  bVar2 = JsonMap::hasKey(pJVar3,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if (bVar2) {
    key = *(string **)(in_RSI + 0x78);
    local_48._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"itemInfoEntries","");
    JsonMap::getObject((JsonMap *)this,key);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != paVar1) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    pJVar3 = (JsonMap *)operator_new(8);
    JsonMap::JsonMap(pJVar3);
    (this->m_packagePath)._M_pathname._M_dataplus._M_p = (pointer)pJVar3;
  }
  return (__uniq_ptr_data<JsonMap,_std::default_delete<JsonMap>,_true,_true>)
         (__uniq_ptr_data<JsonMap,_std::default_delete<JsonMap>,_true,_true>)this;
}

Assistant:

std::unique_ptr<JsonMap> ModelPackageImpl::getItemInfoEntries() const
{
    if (m_manifest->hasKey(kModelPackageItemInfoEntriesKey)) {
        return m_manifest->getObject(kModelPackageItemInfoEntriesKey);
    }

    return std::make_unique<JsonMap>();
}